

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void free_parser_working_data(Parser *p)

{
  uint32 *puVar1;
  PNode **__ptr;
  SNode **__ptr_00;
  Reduction *pRVar2;
  SNode *pSVar3;
  Shift *pSVar4;
  PNode *pPVar5;
  SNode *pSVar6;
  D_Reduction **__ptr_01;
  PNode *pPVar7;
  Reduction *pRVar8;
  Shift *pSVar9;
  Reduction *pRVar10;
  Shift *pSVar11;
  ulong uVar12;
  
  free_old_nodes(p);
  free_old_nodes(p);
  __ptr = (p->pnode_hash).v;
  if (__ptr != (PNode **)0x0) {
    free(__ptr);
  }
  __ptr_00 = (p->snode_hash).v;
  if (__ptr_00 != (SNode **)0x0) {
    free(__ptr_00);
  }
  *(undefined8 *)&(p->snode_hash).n = 0;
  (p->snode_hash).all = (SNode *)0x0;
  (p->snode_hash).v = (SNode **)0x0;
  (p->snode_hash).i = 0;
  (p->snode_hash).m = 0;
  *(undefined8 *)&(p->pnode_hash).n = 0;
  (p->pnode_hash).all = (PNode *)0x0;
  (p->pnode_hash).v = (PNode **)0x0;
  (p->pnode_hash).i = 0;
  (p->pnode_hash).m = 0;
  (p->snode_hash).last_all = (SNode *)0x0;
  pRVar8 = p->reductions_todo;
  if (pRVar8 != (Reduction *)0x0) {
    pRVar10 = p->free_reductions;
    do {
      pRVar2 = pRVar10->next;
      pSVar3 = pRVar8->snode;
      puVar1 = &pSVar3->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_SNode(p,pSVar3);
        pRVar10 = p->free_reductions;
      }
      free(pRVar10);
      p->free_reductions = pRVar2;
      pRVar8 = p->reductions_todo;
      pRVar10 = pRVar2;
    } while (pRVar8 != (Reduction *)0x0);
  }
  pSVar9 = p->shifts_todo;
  if (pSVar9 != (Shift *)0x0) {
    pSVar11 = p->free_shifts;
    do {
      pSVar4 = pSVar11->next;
      pSVar3 = pSVar9->snode;
      puVar1 = &pSVar3->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_SNode(p,pSVar3);
        pSVar11 = p->free_shifts;
      }
      free(pSVar11);
      p->free_shifts = pSVar4;
      pSVar9 = p->shifts_todo;
      pSVar11 = pSVar4;
    } while (pSVar9 != (Shift *)0x0);
  }
  pRVar8 = p->free_reductions;
  while (pRVar8 != (Reduction *)0x0) {
    pRVar10 = pRVar8->next;
    free(pRVar8);
    p->free_reductions = pRVar10;
    pRVar8 = pRVar10;
  }
  pSVar9 = p->free_shifts;
  while (pSVar9 != (Shift *)0x0) {
    pSVar11 = pSVar9->next;
    free(pSVar9);
    p->free_shifts = pSVar11;
    pSVar9 = pSVar11;
  }
  pPVar7 = p->free_pnodes;
  while (pPVar7 != (PNode *)0x0) {
    pPVar5 = pPVar7->all_next;
    free(pPVar7);
    p->free_pnodes = pPVar5;
    pPVar7 = pPVar5;
  }
  pPVar7 = (PNode *)p->free_znodes;
  while (pPVar7 != (PNode *)0x0) {
    pPVar5 = *(PNode **)&pPVar7->hash;
    free(pPVar7);
    p->free_znodes = (ZNode *)pPVar5;
    pPVar7 = pPVar5;
  }
  pSVar3 = p->free_snodes;
  while (pSVar3 != (SNode *)0x0) {
    pSVar6 = pSVar3->all_next;
    free(pSVar3);
    p->free_snodes = pSVar6;
    pSVar3 = pSVar6;
  }
  if ((p->error_reductions).n != 0) {
    uVar12 = 0;
    do {
      free((p->error_reductions).v[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (p->error_reductions).n);
  }
  __ptr_01 = (p->error_reductions).v;
  if (__ptr_01 != (p->error_reductions).e && __ptr_01 != (D_Reduction **)0x0) {
    free(__ptr_01);
  }
  (p->error_reductions).n = 0;
  (p->error_reductions).v = (D_Reduction **)0x0;
  if (p->whitespace_parser != (Parser *)0x0) {
    free_parser_working_data(p->whitespace_parser);
  }
  free(p->shift_results);
  p->shift_results = (ShiftResult *)0x0;
  p->nshift_results = 0;
  free(p->code_shifts);
  p->code_shifts = (D_Shift *)0x0;
  p->ncode_shifts = 0;
  return;
}

Assistant:

static void free_parser_working_data(Parser *p) {
  uint i;

  free_old_nodes(p);
  free_old_nodes(p); /* to catch SNodes saved for error repair */
  if (p->pnode_hash.v) FREE(p->pnode_hash.v);
  if (p->snode_hash.v) FREE(p->snode_hash.v);
  memset(&p->pnode_hash, 0, sizeof(p->pnode_hash));
  memset(&p->snode_hash, 0, sizeof(p->snode_hash));
  while (p->reductions_todo) {
    Reduction *r = p->free_reductions->next;
    unref_sn(p, p->reductions_todo->snode);
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->shifts_todo) {
    Shift *s = p->free_shifts->next;
    unref_sn(p, p->shifts_todo->snode);
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_reductions) {
    Reduction *r = p->free_reductions->next;
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->free_shifts) {
    Shift *s = p->free_shifts->next;
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_pnodes) {
    PNode *pn = p->free_pnodes->all_next;
    FREE(p->free_pnodes);
    p->free_pnodes = pn;
  }
  while (p->free_znodes) {
    ZNode *zn = znode_next(p->free_znodes);
    FREE(p->free_znodes);
    p->free_znodes = zn;
  }
  while (p->free_snodes) {
    SNode *sn = p->free_snodes->all_next;
    FREE(p->free_snodes);
    p->free_snodes = sn;
  }
  for (i = 0; i < p->error_reductions.n; i++) FREE(p->error_reductions.v[i]);
  vec_free(&p->error_reductions);
  if (p->whitespace_parser) free_parser_working_data(p->whitespace_parser);
  FREE(p->shift_results);
  p->shift_results = NULL;
  p->nshift_results = 0;
  FREE(p->code_shifts);
  p->code_shifts = NULL;
  p->ncode_shifts = 0;
}